

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfs-seq.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint d;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  
  lVar4 = (long)_optind;
  if (_optind + 3 < argc) {
    d = atoi(argv[lVar4]);
    uVar1 = atoi(argv[lVar4 + 1]);
    w = uVar1;
    uVar2 = atoi(argv[lVar4 + 2]);
    n = uVar2;
    uVar3 = atoi(argv[lVar4 + 3]);
    printf("Running depth first search on %d balanced trees with depth %d, width %d, grain %d.\n",
           (ulong)uVar3,(ulong)d,(ulong)uVar1,(ulong)uVar2);
    dVar6 = wctime();
    uVar1 = 0;
    if (0 < (int)uVar3) {
      uVar1 = uVar3;
    }
    while (bVar5 = uVar1 != 0, uVar1 = uVar1 - 1, bVar5) {
      tree(d);
    }
    dVar7 = wctime();
    printf("Time: %f\n",dVar7 - dVar6);
    return 0;
  }
  usage(*argv);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    if (optind + 3 >= argc) {
        usage(argv[0]);
        exit(1);
    }

    int d, m;

    d = atoi(argv[optind]);
    w = atoi(argv[optind+1]);
    n = atoi(argv[optind+2]);
    m = atoi(argv[optind+3]);

    printf("Running depth first search on %d balanced trees with depth %d, width %d, grain %d.\n", m, d, w, n);

    double t1 = wctime();
    int i;
    for(i=0; i<m; i++) tree(d);
    double t2 = wctime();

    printf("Time: %f\n", t2-t1);

    return 0;
}